

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.h
# Opt level: O1

void __thiscall Bus::~Bus(Bus *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this_00 = (this->cart).super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  m2C02::~m2C02(&this->ppu);
  (this->cpu).bus._M_t.super___uniq_ptr_impl<Bus,_std::default_delete<Bus>_>._M_t.
  super__Tuple_impl<0UL,_Bus_*,_std::default_delete<Bus>_>.super__Head_base<0UL,_Bus_*,_false>.
  _M_head_impl = (Bus *)0x0;
  std::vector<m6502::INSTRUCTION,_std::allocator<m6502::INSTRUCTION>_>::~vector(&(this->cpu).lookup)
  ;
  std::unique_ptr<Bus,_std::default_delete<Bus>_>::~unique_ptr(&(this->cpu).bus);
  return;
}

Assistant:

~Bus() {}